

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

SigHashType __thiscall
cfd::core::SigHashType::Create
          (SigHashType *this,uint8_t flag,bool is_append_anyone_can_pay,bool is_append_fork_id)

{
  undefined4 extraout_EDX;
  SigHashType SVar1;
  bool is_append_fork_id_local;
  bool is_append_anyone_can_pay_local;
  uint8_t flag_local;
  SigHashType *obj;
  
  SigHashType(this);
  SetFromSigHashFlag(this,flag);
  if (is_append_anyone_can_pay) {
    this->is_anyone_can_pay_ = true;
  }
  if (is_append_fork_id) {
    this->is_fork_id_ = true;
  }
  SVar1.is_anyone_can_pay_ = (bool)(char)extraout_EDX;
  SVar1.is_fork_id_ = (bool)(char)((uint)extraout_EDX >> 8);
  SVar1._10_2_ = (short)((uint)extraout_EDX >> 0x10);
  SVar1._0_8_ = this;
  return SVar1;
}

Assistant:

SigHashType SigHashType::Create(
    uint8_t flag, bool is_append_anyone_can_pay, bool is_append_fork_id) {
  SigHashType obj;
  obj.SetFromSigHashFlag(flag);
  if (is_append_anyone_can_pay) obj.is_anyone_can_pay_ = true;
  if (is_append_fork_id) obj.is_fork_id_ = true;
  return obj;
}